

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

void __thiscall cmComputeTargetDepends::~cmComputeTargetDepends(cmComputeTargetDepends *this)

{
  pointer piVar1;
  pointer ppcVar2;
  
  piVar1 = (this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->ComponentTail).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  piVar1 = (this->ComponentHead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->ComponentHead).super__Vector_base<int,_std::allocator<int>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::~vector
            (&(this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::~vector
            (&(this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_int>,_std::_Select1st<std::pair<const_cmTarget_*const,_int>_>,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_int>_>_>
  ::~_Rb_tree(&(this->TargetIndex)._M_t);
  ppcVar2 = (this->Targets).super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2,(long)(this->Targets).
                                  super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar2
                   );
    return;
  }
  return;
}

Assistant:

cmComputeTargetDepends::~cmComputeTargetDepends()
{
}